

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins_exts.c
# Opt level: O0

LY_ERR lyplg_ext_compile_extension_instance
                 (lysc_ctx *ctx,lysp_ext_instance *extp,lysc_ext_instance *ext)

{
  ly_stmt lVar1;
  ly_bool lVar2;
  void **local_98;
  void **local_88;
  ly_ctx *local_78;
  ly_ctx *local_70;
  undefined1 local_60 [8];
  ly_set storagep_compiled;
  void **storagep;
  void **ppvStack_40;
  ly_stmt stmtp;
  uint64_t v;
  uint64_t u;
  LY_ERR rc;
  lysc_ext_instance *ext_local;
  lysp_ext_instance *extp_local;
  lysc_ctx *ctx_local;
  
  u._4_4_ = LY_SUCCESS;
  memset(local_60,0,0x10);
  if (ctx == (lysc_ctx *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","ctx",
           "lyplg_ext_compile_extension_instance");
    ctx_local._4_4_ = LY_EINVAL;
  }
  else if (extp == (lysp_ext_instance *)0x0) {
    if (ctx == (lysc_ctx *)0x0) {
      local_70 = (ly_ctx *)0x0;
    }
    else {
      local_70 = ctx->ctx;
    }
    ly_log(local_70,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","extp",
           "lyplg_ext_compile_extension_instance");
    ctx_local._4_4_ = LY_EINVAL;
  }
  else if (ext == (lysc_ext_instance *)0x0) {
    if (ctx == (lysc_ctx *)0x0) {
      local_78 = (ly_ctx *)0x0;
    }
    else {
      local_78 = ctx->ctx;
    }
    ly_log(local_78,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","ext",
           "lyplg_ext_compile_extension_instance");
    ctx_local._4_4_ = LY_EINVAL;
  }
  else {
    ctx->ext = ext;
    v = 0;
    while( true ) {
      if (extp->substmts == (lysp_ext_substmt *)0x0) {
        local_88 = (void **)0x0;
      }
      else {
        local_88 = extp->substmts[-1].storage_p;
      }
      if (local_88 <= v) break;
      lVar1 = extp->substmts[v].stmt;
      storagep_compiled.field_2 = (anon_union_8_3_0df1e6ad_for_ly_set_2)extp->substmts[v].storage_p;
      if ((*storagep_compiled.field_2.dnodes != (lyd_node *)0x0) &&
         (lVar2 = ly_set_contains((ly_set *)local_60,storagep_compiled.field_2.dnodes,
                                  (uint32_t *)0x0), lVar2 == '\0')) {
        ppvStack_40 = (void **)0x0;
        while( true ) {
          if (ext->substmts == (lysc_ext_substmt *)0x0) {
            local_98 = (void **)0x0;
          }
          else {
            local_98 = ext->substmts[-1].storage_p;
          }
          if (local_98 <= ppvStack_40) goto LAB_00204b6b;
          if (lVar1 == ext->substmts[(long)ppvStack_40].stmt) break;
          ppvStack_40 = (void **)((long)ppvStack_40 + 1);
        }
        u._4_4_ = lys_compile_ext_instance_stmt
                            (ctx,storagep_compiled.field_2.objs,ext,
                             ext->substmts + (long)ppvStack_40);
        if (u._4_4_ != LY_SUCCESS) break;
LAB_00204b6b:
        ly_set_add((ly_set *)local_60,storagep_compiled.field_2.dnodes,'\x01',(uint32_t *)0x0);
      }
      v = v + 1;
    }
    ctx->ext = (lysc_ext_instance *)0x0;
    ly_set_erase((ly_set *)local_60,(_func_void_void_ptr *)0x0);
    ctx_local._4_4_ = u._4_4_;
  }
  return ctx_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyplg_ext_compile_extension_instance(struct lysc_ctx *ctx, const struct lysp_ext_instance *extp,
        struct lysc_ext_instance *ext)
{
    LY_ERR rc = LY_SUCCESS;
    LY_ARRAY_COUNT_TYPE u, v;
    enum ly_stmt stmtp;
    void **storagep;
    struct ly_set storagep_compiled = {0};

    LY_CHECK_ARG_RET(ctx ? ctx->ctx : NULL, ctx, extp, ext, LY_EINVAL);

    /* note into the compile context that we are processing extension now */
    ctx->ext = ext;

    LY_ARRAY_FOR(extp->substmts, u) {
        stmtp = extp->substmts[u].stmt;
        storagep = extp->substmts[u].storage_p;

        if (!*storagep || ly_set_contains(&storagep_compiled, storagep, NULL)) {
            /* nothing parsed or already compiled (for example, if it is a linked list of parsed nodes) */
            continue;
        }

        LY_ARRAY_FOR(ext->substmts, v) {
            if (stmtp != ext->substmts[v].stmt) {
                continue;
            }

            if ((rc = lys_compile_ext_instance_stmt(ctx, storagep, ext, &ext->substmts[v]))) {
                goto cleanup;
            }

            /* parsed substatement compiled */
            break;
        }

        /* compiled */
        ly_set_add(&storagep_compiled, storagep, 1, NULL);
    }

cleanup:
    ctx->ext = NULL;
    ly_set_erase(&storagep_compiled, NULL);
    return rc;
}